

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O0

void __thiscall
async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::setException
          (Try<std::pair<std::error_code,_unsigned_long>_> *this,exception_ptr *error)

{
  bool bVar1;
  exception_ptr *peVar2;
  variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  *in_RSI;
  exception_ptr *in_stack_ffffffffffffffd8;
  
  bVar1 = std::
          holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                      *)0x18c252);
  if (bVar1) {
    peVar2 = std::
             get<std::__exception_ptr::exception_ptr,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                       ((variant<std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                         *)0x18c262);
    bVar1 = std::__exception_ptr::operator==(peVar2,(exception_ptr *)in_RSI);
    if (bVar1) {
      return;
    }
  }
  std::
  variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
  ::emplace<std::__exception_ptr::exception_ptr,std::__exception_ptr::exception_ptr&>
            (in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void setException(std::exception_ptr error) {
        if (std::holds_alternative<std::exception_ptr>(_value) &&
            std::get<std::exception_ptr>(_value) == error) {
            return;
        }
        _value.template emplace<std::exception_ptr>(error);
    }